

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::
     RenderLineSegments<ImPlot::GetterXsYs<double>,ImPlot::GetterXsYRef<double>,ImPlot::TransformerLinLin>
               (GetterXsYs<double> *getter1,GetterXsYRef<double> *getter2,
               TransformerLinLin *transformer,ImDrawList *DrawList,float line_weight,ImU32 col)

{
  ImPlotPlot *pIVar1;
  ImPlotContext *pIVar2;
  bool bVar3;
  LineSegmentsRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYRef<double>,_ImPlot::TransformerLinLin>
  local_b8;
  ImVec2 local_90;
  ImVec2 local_88;
  ImRect local_80;
  ImPlotPoint local_70;
  ImVec2 local_60;
  ImVec2 p2;
  ImVec2 local_48;
  ImVec2 p1;
  int i;
  int I;
  ImPlotContext *gp;
  ImU32 col_local;
  float line_weight_local;
  ImDrawList *DrawList_local;
  TransformerLinLin *transformer_local;
  GetterXsYRef<double> *getter2_local;
  GetterXsYs<double> *getter1_local;
  
  pIVar2 = GImPlot;
  bVar3 = ImHasFlag<int,ImPlotFlags_>(GImPlot->CurrentPlot->Flags,ImPlotFlags_AntiAliased);
  if ((bVar3) || (((pIVar2->Style).AntiAliasedLines & 1U) != 0)) {
    p1.y = (float)ImMin<int>(getter1->Count,getter2->Count);
    for (p1.x = 0.0; (int)p1.x < (int)p1.y; p1.x = (float)((int)p1.x + 1)) {
      _p2 = GetterXsYs<double>::operator()(getter1,(int)p1.x);
      local_48 = TransformerLinLin::operator()(transformer,(ImPlotPoint *)&p2);
      local_70 = GetterXsYRef<double>::operator()(getter2,(int)p1.x);
      local_60 = TransformerLinLin::operator()(transformer,&local_70);
      pIVar1 = pIVar2->CurrentPlot;
      local_88 = ImMin(&local_48,&local_60);
      local_90 = ImMax(&local_48,&local_60);
      ImRect::ImRect(&local_80,&local_88,&local_90);
      bVar3 = ImRect::Overlaps(&pIVar1->PlotRect,&local_80);
      if (bVar3) {
        ImDrawList::AddLine(DrawList,&local_48,&local_60,col,line_weight);
      }
    }
  }
  else {
    LineSegmentsRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYRef<double>,_ImPlot::TransformerLinLin>
    ::LineSegmentsRenderer(&local_b8,getter1,getter2,transformer,col,line_weight);
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterXsYs<double>,ImPlot::GetterXsYRef<double>,ImPlot::TransformerLinLin>>
              (&local_b8,DrawList,&pIVar2->CurrentPlot->PlotRect);
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}